

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::HlslParseContext::executeDeclaration
          (HlslParseContext *this,TSourceLoc *loc,TVariable *variable)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  TIntermSymbol *var;
  TIntermSymbol *intermSymbol;
  TStorageQualifier qualifier;
  TVariable *variable_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  iVar1 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))();
  if ((*(ulong *)(lVar2 + 8) & 0x7f) == 0) {
    var = TIntermediate::addSymbol
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc)
    ;
    this_local = (HlslParseContext *)handleDeclare(this,loc,&var->super_TIntermTyped);
  }
  else {
    this_local = (HlslParseContext *)0x0;
  }
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* HlslParseContext::executeDeclaration(const TSourceLoc& loc, TVariable* variable)
{
  //
  // Identifier must be of type temporary.
  //
  TStorageQualifier qualifier = variable->getType().getQualifier().storage;
  if (qualifier != EvqTemporary)
      return nullptr;

  TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
  return handleDeclare(loc, intermSymbol);
}